

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggwave-common-sdl2.cpp
# Opt level: O3

bool GGWave_mainLoop(void)

{
  bool bVar1;
  bool bVar2;
  char cVar3;
  undefined4 uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined8 uVar8;
  time_point tVar9;
  allocator_type local_29;
  
  bVar1 = (anonymous_namespace)::g_devIdOut != 0;
  bVar2 = (anonymous_namespace)::g_devIdInp != 0;
  tVar9.__d.__r = GGWave_mainLoop::tLastNoData.__d.__r;
  if (bVar1 || bVar2) {
    cVar3 = GGWave::txHasData();
    if (cVar3 == '\0') {
      SDL_PauseAudioDevice((anonymous_namespace)::g_devIdOut,0);
      if (GGWave_mainLoop()::tLastNoData == '\0') {
        GGWave_mainLoop();
      }
      tVar9.__d.__r = (duration)std::chrono::_V2::system_clock::now();
      iVar5 = SDL_GetQueuedAudioSize((anonymous_namespace)::g_devIdOut);
      iVar6 = GGWave::samplesPerFrame();
      iVar7 = GGWave::sampleSizeOut();
      if (iVar5 < iVar7 * iVar6) {
        SDL_PauseAudioDevice((anonymous_namespace)::g_devIdInp,0);
        iVar5 = SDL_GetQueuedAudioSize((anonymous_namespace)::g_devIdInp);
        iVar6 = GGWave::samplesPerFrame();
        iVar7 = GGWave::sampleSizeInp();
        if (((float)(((long)tVar9.__d.__r - (long)GGWave_mainLoop::tLastNoData.__d.__r) / 1000) /
             1000.0 <= 500.0) || (iVar7 = iVar7 * iVar6, iVar5 < iVar7)) {
          SDL_ClearQueuedAudio((anonymous_namespace)::g_devIdInp);
          tVar9 = GGWave_mainLoop::tLastNoData;
        }
        else {
          if ((GGWave_mainLoop()::dataInp == '\0') &&
             (iVar6 = __cxa_guard_acquire(&GGWave_mainLoop()::dataInp), iVar6 != 0)) {
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                      (&GGWave_mainLoop::dataInp,(long)iVar7,&local_29);
            __cxa_atexit(std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector,
                         &GGWave_mainLoop::dataInp,&__dso_handle);
            __cxa_guard_release(&GGWave_mainLoop()::dataInp);
          }
          SDL_DequeueAudio((anonymous_namespace)::g_devIdInp,
                           GGWave_mainLoop::dataInp.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start,iVar7);
          cVar3 = GGWave::decode((anonymous_namespace)::g_ggWave,
                                 (uint)GGWave_mainLoop::dataInp.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start);
          if (cVar3 == '\0') {
            GGWave_mainLoop();
          }
          tVar9.__d.__r = GGWave_mainLoop::tLastNoData.__d.__r;
          if (iVar7 * 0x20 < iVar5) {
            GGWave_mainLoop();
            tVar9 = GGWave_mainLoop::tLastNoData;
          }
        }
      }
    }
    else {
      SDL_PauseAudioDevice((anonymous_namespace)::g_devIdOut,1);
      SDL_PauseAudioDevice((anonymous_namespace)::g_devIdInp,1);
      uVar4 = GGWave::encode();
      iVar5 = (anonymous_namespace)::g_devIdOut;
      uVar8 = GGWave::txWaveform();
      SDL_QueueAudio(iVar5,uVar8,uVar4);
      tVar9 = GGWave_mainLoop::tLastNoData;
    }
  }
  GGWave_mainLoop::tLastNoData.__d.__r = tVar9.__d.__r;
  return bVar1 || bVar2;
}

Assistant:

bool GGWave_mainLoop() {
    if (g_devIdInp == 0 && g_devIdOut == 0) {
        return false;
    }

    if (g_ggWave->txHasData() == false) {
        SDL_PauseAudioDevice(g_devIdOut, SDL_FALSE);

        static auto tLastNoData = std::chrono::high_resolution_clock::now();
        auto tNow = std::chrono::high_resolution_clock::now();

        if ((int) SDL_GetQueuedAudioSize(g_devIdOut) < g_ggWave->samplesPerFrame()*g_ggWave->sampleSizeOut()) {
            SDL_PauseAudioDevice(g_devIdInp, SDL_FALSE);
            const int nHave = (int) SDL_GetQueuedAudioSize(g_devIdInp);
            const int nNeed = g_ggWave->samplesPerFrame()*g_ggWave->sampleSizeInp();
            if (::getTime_ms(tLastNoData, tNow) > 500.0f && nHave >= nNeed) {
                static std::vector<uint8_t> dataInp(nNeed);
                SDL_DequeueAudio(g_devIdInp, dataInp.data(), nNeed);

                if (g_ggWave->decode(dataInp.data(), dataInp.size()) == false) {
                    fprintf(stderr, "Warning: failed to decode input data!\n");
                }

                if (nHave > 32*nNeed) {
                    fprintf(stderr, "Warning: slow processing, clearing queued audio buffer of %d bytes ...\n", SDL_GetQueuedAudioSize(g_devIdInp));
                    SDL_ClearQueuedAudio(g_devIdInp);
                }
            } else {
                SDL_ClearQueuedAudio(g_devIdInp);
            }
        } else {
            tLastNoData = tNow;
        }
    } else {
        SDL_PauseAudioDevice(g_devIdOut, SDL_TRUE);
        SDL_PauseAudioDevice(g_devIdInp, SDL_TRUE);

        const auto nBytes = g_ggWave->encode();
        SDL_QueueAudio(g_devIdOut, g_ggWave->txWaveform(), nBytes);
    }

    return true;
}